

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void splitbill(obj *obj,obj *otmp)

{
  short sVar1;
  long lVar2;
  int iVar3;
  monst *mtmp;
  bill_x *pbVar4;
  int iVar5;
  char *s;
  long lVar6;
  
  mtmp = shop_keeper(level,u.ushops[0]);
  if (mtmp != (monst *)0x0) {
    iVar3 = inhishop(mtmp);
    if (iVar3 != 0) {
      pbVar4 = onbill(obj,mtmp,'\0');
      if (pbVar4 != (bill_x *)0x0) {
        iVar5 = pbVar4->bquan;
        iVar3 = otmp->quan;
        if (iVar5 < iVar3) {
          warning("Negative quantity on bill??");
          iVar5 = pbVar4->bquan;
          iVar3 = otmp->quan;
        }
        if (iVar5 == iVar3) {
          warning("Zero quantity on bill??");
          iVar3 = otmp->quan;
          iVar5 = pbVar4->bquan;
        }
        pbVar4->bquan = iVar5 - iVar3;
        sVar1 = *(short *)((long)&mtmp[0x1b].misc_worn_check + 2);
        if ((long)sVar1 == 200) {
          otmp->field_0x4a = otmp->field_0x4a & 0xfb;
        }
        else {
          iVar5 = pbVar4->price;
          lVar2 = *(long *)&mtmp[0x1b].mnum;
          lVar6 = (long)sVar1 * 0x10;
          *(uint *)(lVar2 + lVar6) = otmp->o_id;
          *(int *)(lVar2 + 0xc + lVar6) = iVar3;
          *(undefined1 *)(lVar2 + 4 + lVar6) = 0;
          *(int *)(lVar2 + 8 + lVar6) = iVar5;
          *(short *)((long)&mtmp[0x1b].misc_worn_check + 2) = sVar1 + 1;
        }
        return;
      }
      s = "splitbill: not on bill?";
      goto LAB_0023f1cf;
    }
  }
  s = "splitbill: no resident shopkeeper??";
LAB_0023f1cf:
  warning(s);
  return;
}

Assistant:

void splitbill(struct obj *obj, struct obj *otmp)
{
	/* otmp has been split off from obj */
	struct bill_x *bp;
	long tmp;
	struct monst *shkp = shop_keeper(level, *u.ushops);

	if (!shkp || !inhishop(shkp)) {
		warning("splitbill: no resident shopkeeper??");
		return;
	}
	bp = onbill(obj, shkp, FALSE);
	if (!bp) {
		warning("splitbill: not on bill?");
		return;
	}
	if (bp->bquan < otmp->quan) {
		warning("Negative quantity on bill??");
	}
	if (bp->bquan == otmp->quan) {
		warning("Zero quantity on bill??");
	}
	bp->bquan -= otmp->quan;

	if (ESHK(shkp)->billct == BILLSZ) otmp->unpaid = 0;
	else {
		tmp = bp->price;
		bp = &(ESHK(shkp)->bill_p[ESHK(shkp)->billct]);
		bp->bo_id = otmp->o_id;
		bp->bquan = otmp->quan;
		bp->useup = 0;
		bp->price = tmp;
		ESHK(shkp)->billct++;
	}
}